

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardmanager.h
# Opt level: O1

SuperblockType * __thiscall
Hoard::
HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::EmptyHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>_>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>_>
::get(HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::EmptyHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>_>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>_>
      *this,size_t sz,
     ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>
     *dest)

{
  ulong uVar1;
  int *piVar2;
  __int_type _Var3;
  int iVar4;
  SuperblockType *s;
  size_t sVar5;
  SuperblockType *pSVar6;
  ulong uVar7;
  
  LOCK();
  _Var3 = (this->_theLock)._mutex._M_base._M_i;
  (this->_theLock)._mutex._M_base._M_i = true;
  UNLOCK();
  if ((_Var3 & 1U) != 0) {
    HL::SpinLockType::contendedLock(&this->_theLock);
  }
  sVar5 = 0x10;
  if (0x10 < sz) {
    sVar5 = sz;
  }
  uVar1 = sVar5 * 2 - 1;
  uVar7 = 0x3f;
  if (uVar1 != 0) {
    for (; uVar1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  uVar7 = uVar7 ^ 0xffffffffffffffc0;
  pSVar6 = this[3]._otherBins._item[uVar7 + 8].
           super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
           ._available._item[3];
  if (pSVar6 == (SuperblockType *)0x0) {
    pSVar6 = EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
             ::get((EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
                    *)(this[3]._otherBins._item[uVar7 + 7].
                       super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
                       ._available._item + 4));
  }
  else {
    this[3]._otherBins._item[uVar7 + 8].
    super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
    ._available._item[3] =
         (HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>
          *)0x0;
  }
  if (pSVar6 != (SuperblockType *)0x0) {
    iVar4 = *(int *)(pSVar6 + 0x1c);
    *(int *)((this->_otherBins)._item[4].
             super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
             ._available._item + uVar7 + 1) =
         (*(int *)((this->_otherBins)._item[4].
                   super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
                   ._available._item + uVar7 + 1) - iVar4) + *(int *)(pSVar6 + 0x44);
    piVar2 = (int *)((long)(this->_otherBins)._item[4].
                           super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>,_Hoard::HoardSuperblockHeader>,_8>
                           ._available._item + uVar7 * 8 + 0xc);
    *piVar2 = *piVar2 - iVar4;
    *(ProcessHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_HL::SpinLockType,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::bogusThresholdFunctionClass,_Hoard::MmapSource>
      **)(pSVar6 + 0x28) = dest;
  }
  LOCK();
  (this->_theLock)._mutex._M_base._M_i = false;
  UNLOCK();
  return pSVar6;
}

Assistant:

NO_INLINE SuperblockType * get (size_t sz, HeapType * dest) {
      std::lock_guard<LockType> l (_theLock);
      Check<HoardManager, sanityCheck> check (this);
      const auto binIndex = binType::getSizeClass (sz);
      auto * s = _otherBins(binIndex).get();
      if (s) {
	assert (s->isValidSuperblock());
      
	// Update the statistics, removing objects in use and allocated for s.
	decStatsSuperblock (s, binIndex);
	s->setOwner (dest);
      }
      // printf ("getting sb %x (size %d) on %x\n", (void *) s, sz, (void *) this);
      return s;
    }